

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[25],unsigned_int&,kj::StringPtr&>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [25],
          uint *params_1,StringPtr *params_2)

{
  uint *params_00;
  StringPtr *params_01;
  long lVar1;
  ArrayPtr<kj::String> argValues_00;
  String argValues [3];
  
  str<char_const(&)[25]>(argValues,(kj *)macroArgs,(char (*) [25])macroArgs);
  str<unsigned_int&>(argValues + 1,(kj *)params,params_00);
  str<kj::StringPtr&>(argValues + 2,(kj *)params_1,params_01);
  argValues_00.size_ = 3;
  argValues_00.ptr = argValues;
  makeDescriptionInternal(__return_storage_ptr__,(char *)this,argValues_00);
  lVar1 = 0x30;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}